

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O1

void __thiscall
gl4cts::ShaderSubroutine::FunctionalTest18_19::verifyXFBData
          (FunctionalTest18_19 *this,GLvoid *data,GLuint bool_operator1_subroutine_location,
          GLuint bool_operator2_subroutine_location,GLuint vec4_operator1_subroutine_location,
          GLuint vec4_operator2_subroutine_location)

{
  GLuint GVar1;
  code *pcVar2;
  int iVar3;
  code *pcVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float local_218;
  float local_214;
  float local_210;
  float local_20c;
  float local_208;
  float local_204;
  float local_200;
  float local_1fc;
  ulong local_1f8;
  ulong local_1f0;
  ulong local_1e8;
  ulong local_1e0;
  float *local_1d8;
  undefined1 local_1d0 [16];
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [8];
  float local_1a8;
  float local_1a4;
  ios_base local_138 [264];
  
  pcVar2 = vec4operator_mul4;
  pcVar4 = vec4operator_mul4;
  if (this->m_po_subroutine_divide_by_two_location == vec4_operator1_subroutine_location) {
    pcVar4 = vec4operator_div2;
  }
  if (this->m_po_subroutine_divide_by_two_location == vec4_operator2_subroutine_location) {
    pcVar2 = vec4operator_div2;
  }
  if (this->m_n_points_to_draw != 0) {
    GVar1 = this->m_po_subroutine_returns_true_location;
    local_1e0 = (ulong)bool_operator1_subroutine_location;
    local_1e8 = (ulong)bool_operator2_subroutine_location;
    local_1f0 = (ulong)vec4_operator1_subroutine_location;
    local_1f8 = (ulong)vec4_operator2_subroutine_location;
    uVar5 = 0;
    iVar3 = 0;
    do {
      if (GVar1 == bool_operator1_subroutine_location) {
        fVar11 = (float)((int)uVar5 * 6 + 2);
        do {
          fVar11 = fVar11 / (float)((int)uVar5 + 2);
        } while (1.0 < fVar11);
      }
      else {
        fVar8 = (float)(uVar5 & 0xffffffff);
        fVar9 = fVar8 + 1.0;
        fVar10 = fVar8 + 2.0;
        fVar11 = fVar8 + 3.0;
        local_1d8 = (float *)data;
        if ((uVar5 & 1) == 0) {
          if (uVar5 != 0 && GVar1 == bool_operator2_subroutine_location) {
            uVar7 = 1;
            do {
              local_208 = fVar8;
              local_204 = fVar9;
              local_200 = fVar10;
              local_1fc = fVar11;
              (*pcVar4)(local_1c0,&local_208);
              (*pcVar2)(local_1b0,local_1c0);
              fVar11 = local_1a4;
              fVar10 = local_1a8;
              fVar9 = (float)local_1b0._4_4_;
              fVar8 = (float)local_1b0._0_4_;
              if (uVar5 <= uVar7) break;
              uVar7 = (ulong)((int)uVar7 + 1);
            } while (GVar1 == bool_operator2_subroutine_location);
          }
        }
        else {
          iVar6 = iVar3;
          if ((uVar5 & 0x7fffffff) != 0) {
            do {
              local_218 = fVar8;
              local_214 = fVar9;
              local_210 = fVar10;
              local_20c = fVar11;
              (*pcVar2)(local_1d0,&local_218);
              (*pcVar4)(local_1b0,local_1d0);
              iVar6 = iVar6 + -1;
              fVar11 = local_1a4;
              fVar10 = local_1a8;
              fVar9 = (float)local_1b0._4_4_;
              fVar8 = (float)local_1b0._0_4_;
            } while (iVar6 != 0);
          }
        }
        fVar11 = fVar9 + fVar8 + fVar10 + fVar11;
        data = local_1d8;
      }
      fVar9 = fVar11 - *data;
      fVar10 = -fVar9;
      if (-fVar9 <= fVar9) {
        fVar10 = fVar9;
      }
      if (1e-05 < fVar10) {
        local_1b0 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"XFBed data was found to be invalid at index [",0x2d);
        std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,
                   "]for the following subroutine location configuration: bool_operator1_subroutine_location:["
                   ,0x5a);
        std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"] bool_operator2_subroutine_location:[",0x26);
        std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"] vec4_operator1_subroutine_location:[",0x26);
        std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"] vec4_operator2_subroutine_location:[",0x26);
        std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"]; expected data:",0x11);
        std::ostream::_M_insert<double>((double)fVar11);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", found:",8);
        std::ostream::_M_insert<double>((double)*data);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        this->m_has_test_passed = false;
      }
      data = (GLvoid *)((long)data + 4);
      uVar5 = uVar5 + 1;
      iVar3 = iVar3 + 2;
    } while (uVar5 < this->m_n_points_to_draw);
  }
  return;
}

Assistant:

void FunctionalTest18_19::verifyXFBData(const glw::GLvoid* data, glw::GLuint bool_operator1_subroutine_location,
										glw::GLuint bool_operator2_subroutine_location,
										glw::GLuint vec4_operator1_subroutine_location,
										glw::GLuint vec4_operator2_subroutine_location)
{
	bool				bool_operator1_result = false;
	bool				bool_operator2_result = false;
	const float			epsilon				  = 1e-5f;
	PFNVEC4OPERATORPROC pVec4Operator1		  = NULL;
	PFNVEC4OPERATORPROC pVec4Operator2		  = NULL;
	const glw::GLfloat* traveller_ptr		  = (const glw::GLfloat*)data;

	bool_operator1_result = (bool_operator1_subroutine_location == m_po_subroutine_returns_true_location);
	bool_operator2_result = (bool_operator2_subroutine_location == m_po_subroutine_returns_true_location);
	pVec4Operator1		  = (vec4_operator1_subroutine_location == m_po_subroutine_divide_by_two_location) ?
						 vec4operator_div2 :
						 vec4operator_mul4;
	pVec4Operator2 = (vec4_operator2_subroutine_location == m_po_subroutine_divide_by_two_location) ?
						 vec4operator_div2 :
						 vec4operator_mul4;

	for (unsigned int n_vertex = 0; n_vertex < m_n_points_to_draw; ++n_vertex)
	{
		float expected_value = 0.0f;

		if (bool_operator1_result)
		{
			float value = float((3 * n_vertex + 1) * 2);

			while (bool_operator1_result)
			{
				value /= float(n_vertex + 2);

				if (value <= 1.0f)
					break;
			}

			expected_value = value;
		}
		else
		{
			tcu::Vec4 value((float)n_vertex, (float)n_vertex + 1, (float)n_vertex + 2, (float)n_vertex + 3);

			switch (n_vertex % 2)
			{
			case 0:
			{
				for (unsigned int iteration = 0; iteration < n_vertex && bool_operator2_result; ++iteration)
				{
					value = pVec4Operator2(pVec4Operator1(value));
				}

				break;
			}

			case 1:
			{
				for (unsigned int iteration = 0; iteration < n_vertex * 2; ++iteration)
				{
					value = pVec4Operator1(pVec4Operator2(value));
				}

				break;
			}
			} /* switch (n_vertex % 2) */

			expected_value = value.x() + value.y() + value.z() + value.w();
		}

		if (de::abs(expected_value - *traveller_ptr) > epsilon)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "XFBed data was found to be invalid at index [" << n_vertex
							   << "]"
								  "for the following subroutine location configuration:"
								  " bool_operator1_subroutine_location:["
							   << bool_operator1_subroutine_location << "]"
																		" bool_operator2_subroutine_location:["
							   << bool_operator2_subroutine_location << "]"
																		" vec4_operator1_subroutine_location:["
							   << vec4_operator1_subroutine_location << "]"
																		" vec4_operator2_subroutine_location:["
							   << vec4_operator2_subroutine_location << "];"
																		" expected data:"
							   << expected_value << ", found:" << *traveller_ptr << tcu::TestLog::EndMessage;

			m_has_test_passed = false;
		}

		++traveller_ptr;
	} /* for (all drawn points) */
}